

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O1

void lust_pulse(CHAR_DATA *ch,AFFECT_DATA *af)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  OBJ_DATA *obj;
  char buf [4608];
  char acStack_1228 [4616];
  
  if ((ch->fighting == (CHAR_DATA *)0x0) && (bVar1 = is_awake(ch), bVar1)) {
    iVar2 = skill_lookup("steal");
    iVar3 = get_skill(ch,iVar2);
    iVar2 = 0x32;
    if ((int)((double)iVar3 * 0.8) != 0) {
      iVar2 = (int)((double)iVar3 * 0.8);
    }
    for (ch_00 = ch->in_room->people; ch_00 != (CHAR_DATA *)0x0; ch_00 = ch_00->next_in_room) {
      if (((ch_00 != ch) && (bVar1 = is_safe_new(ch_00,ch,false), !bVar1)) &&
         (iVar3 = number_percent(), 0x5e < iVar3)) {
        for (obj = ch_00->carrying; obj != (OBJ_DATA *)0x0; obj = obj->next_content) {
          if (((obj->wear_loc == -1) && (bVar1 = can_see_obj(ch,obj), bVar1)) &&
             (iVar3 = number_percent(), 0x5e < iVar3)) {
            act("Overcome by greed, you suddenly reach for $N\'s pack!",ch,(void *)0x0,ch_00,3);
            iVar3 = number_percent();
            if (iVar3 <= iVar2) {
              obj_from_char(obj);
              obj_to_char(obj,ch);
              act("You carefully slip $p away from $N.",ch,obj,ch_00,3);
              return;
            }
            sprintf(acStack_1228,"%s tried to steal from me!",ch->name);
            do_myell(ch_00,acStack_1228,ch);
            bVar1 = is_npc(ch_00);
            if (!bVar1) {
              return;
            }
            multi_hit(ch_00,ch,-1);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void lust_pulse(CHAR_DATA *ch, AFFECT_DATA *af)
{
	OBJ_DATA *steal;
	CHAR_DATA *victim;
	char buf[MSL];
	int skill;

	if (ch->fighting || !is_awake(ch))
		return;

	skill = (int)(get_skill(ch, skill_lookup("steal")) * 0.8);

	if (skill == 0)
		skill = 50;

	for (victim = ch->in_room->people; victim; victim = victim->next_in_room)
	{
		if ((victim == ch) || (is_safe_new(victim, ch, false)) || number_percent() < 95)
			continue;

		for (steal = victim->carrying; steal; steal = steal->next_content)
		{
			if (steal->wear_loc != WEAR_NONE || !can_see_obj(ch, steal) || number_percent() < 95)
				continue;

			act("Overcome by greed, you suddenly reach for $N's pack!", ch, 0, victim, TO_CHAR);

			if (number_percent() > skill)
			{
				sprintf(buf, "%s tried to steal from me!", ch->name);
				do_myell(victim, buf, ch);

				if (is_npc(victim))
					multi_hit(victim, ch, TYPE_UNDEFINED);
			}
			else
			{
				obj_from_char(steal);
				obj_to_char(steal, ch);
				act("You carefully slip $p away from $N.", ch, steal, victim, TO_CHAR);
			}

			return;
		}
	}
}